

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glSetPixelShaderUniformB(uint idx,int *data,uint bcount)

{
  uint8 *puVar1;
  uint uVar2;
  uint8 *endptr;
  uint8 *wptr;
  uint maxregs;
  uint bcount_local;
  int *data_local;
  uint idx_local;
  
  if (idx < 0x1ff) {
    puVar1 = ctx->ps_reg_file_b;
    uVar2 = minuint(0x1ff - idx,bcount);
    endptr = puVar1 + idx;
    _maxregs = data;
    while (endptr != puVar1 + idx + uVar2) {
      *endptr = *_maxregs != 0;
      endptr = endptr + 1;
      _maxregs = _maxregs + 1;
    }
    ctx->generation = ctx->generation + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetPixelShaderUniformB(unsigned int idx, const int *data,
                                         unsigned int bcount)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_b) / 4;
    if (idx < maxregs)
    {
        uint8 *wptr = ctx->ps_reg_file_b + idx;
        uint8 *endptr = wptr + minuint(maxregs - idx, bcount);
        while (wptr != endptr)
            *(wptr++) = *(data++) ? 1 : 0;
        ctx->generation++;
    } // if
}